

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs(Aig_Man_t *pAig)

{
  Aig_Obj_t **ppAVar1;
  int *piVar2;
  int iVar3;
  Ssw_Cla_t *pSVar4;
  Aig_Obj_t **ppAVar5;
  void *pvVar6;
  Aig_Obj_t *pAVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Vec_Ptr_t *p;
  
  pSVar4 = Ssw_ClassesStart(pAig);
  p = pAig->vObjs;
  iVar3 = p->nSize;
  ppAVar5 = (Aig_Obj_t **)calloc((long)iVar3,8);
  pSVar4->pMemClasses = ppAVar5;
  pSVar4->nCands1 = 0;
  iVar10 = 0;
  iVar9 = 0;
  do {
    if (iVar3 <= iVar9) {
      pSVar4->nClasses = 0;
      pvVar6 = calloc((long)iVar3,4);
      iVar10 = 0;
      lVar11 = 0;
      iVar9 = 0;
      while( true ) {
        if (iVar3 <= lVar11) break;
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p,(int)lVar11);
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          iVar3 = pSVar4->pClassSizes[lVar11];
          if (iVar3 == 0) {
            ppAVar1 = pAig->pReprs;
            if ((((ppAVar1 != (Aig_Obj_t **)0x0) && (ppAVar1 != (Aig_Obj_t **)0x0)) &&
                (ppAVar1[pAVar7->Id] != pAig->pConst1)) && (ppAVar1[pAVar7->Id] != (Aig_Obj_t *)0x0)
               ) {
              lVar8 = (long)ppAVar1[pAVar7->Id]->Id;
              ppAVar1 = pSVar4->pId2Class[lVar8];
              iVar3 = *(int *)((long)pvVar6 + lVar8 * 4);
              *(int *)((long)pvVar6 + lVar8 * 4) = iVar3 + 1;
              ppAVar1[iVar3] = pAVar7;
            }
          }
          else {
            lVar8 = (long)iVar9;
            pSVar4->pId2Class[lVar11] = ppAVar5 + lVar8;
            iVar9 = iVar3 + iVar9;
            iVar3 = *(int *)((long)pvVar6 + lVar11 * 4);
            *(int *)((long)pvVar6 + lVar11 * 4) = iVar3 + 1;
            (ppAVar5 + lVar8)[iVar3] = pAVar7;
            iVar10 = iVar10 + 1;
            pSVar4->nClasses = iVar10;
          }
        }
        lVar11 = lVar11 + 1;
        p = pAig->vObjs;
        iVar3 = p->nSize;
      }
      pSVar4->pMemClassesFree = ppAVar5 + iVar9;
      pSVar4->nLits = iVar9 - iVar10;
      iVar3 = bcmp(pvVar6,pSVar4->pClassSizes,(long)iVar3 << 2);
      if (iVar3 == 0) {
        free(pvVar6);
        return pSVar4;
      }
      __assert_fail("memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswClass.c"
                    ,0x32d,"Ssw_Cla_t *Ssw_ClassesPrepareFromReprs(Aig_Man_t *)");
    }
    pvVar6 = Vec_PtrEntry(p,iVar9);
    if (pvVar6 != (void *)0x0) {
      ppAVar1 = pAig->pReprs;
      if (ppAVar1 == (Aig_Obj_t **)0x0) {
        if (pAig->pConst1 == (Aig_Obj_t *)0x0) goto LAB_007350c6;
      }
      else if (ppAVar1[*(int *)((long)pvVar6 + 0x24)] == pAig->pConst1) {
LAB_007350c6:
        iVar10 = iVar10 + 1;
        pSVar4->nCands1 = iVar10;
      }
      else {
        pAVar7 = ppAVar1[*(int *)((long)pvVar6 + 0x24)];
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          piVar2 = pSVar4->pClassSizes;
          iVar3 = piVar2[pAVar7->Id];
          piVar2[pAVar7->Id] = iVar3 + 1;
          if (iVar3 == 0) {
            piVar2[pAVar7->Id] = piVar2[pAVar7->Id] + 1;
          }
        }
      }
    }
    iVar9 = iVar9 + 1;
    p = pAig->vObjs;
    iVar3 = p->nSize;
  } while( true );
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareFromReprs( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj, * pRepr;
    int * pClassSizes, nEntries, i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // allocate memory for classes
    p->pMemClasses = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // count classes
    p->nCands1 = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
        {
            p->nCands1++;
            continue;
        }
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
        {
            if ( p->pClassSizes[pRepr->Id]++ == 0 )
                p->pClassSizes[pRepr->Id]++;
        }
    }
    // add nodes
    nEntries = 0;
    p->nClasses = 0;
    pClassSizes = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    Aig_ManForEachObj( pAig, pObj, i )
    {
        if ( p->pClassSizes[i] )
        {
            p->pId2Class[i] = p->pMemClasses + nEntries;
            nEntries += p->pClassSizes[i];
            p->pId2Class[i][pClassSizes[i]++] = pObj;
            p->nClasses++;
            continue;
        }
        if ( Ssw_ObjIsConst1Cand(pAig, pObj) )
            continue;
        if ( (pRepr = Aig_ObjRepr(pAig, pObj)) )
            p->pId2Class[pRepr->Id][pClassSizes[pRepr->Id]++] = pObj;
    }
    p->pMemClassesFree = p->pMemClasses + nEntries;
    p->nLits = nEntries - p->nClasses;
    assert( memcmp(pClassSizes, p->pClassSizes, sizeof(int)*Aig_ManObjNumMax(pAig)) == 0 );
    ABC_FREE( pClassSizes );
//    Abc_Print( 1, "After converting:\n" );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}